

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ServerSession::on_control_message(ServerSession *this)

{
  PacketHeader *in_RSI;
  
  on_control_message((ServerSession *)
                     ((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-6]),in_RSI
                    );
  return;
}

Assistant:

void ServerSession::on_control_message(const PacketHeader& header)
	{
		switch ((control::Opcode)header.get_opcode())
		{
		case control::Opcode::SESSION_ACCEPT:
			on_session_accept();
			break;

		case control::Opcode::KEEP_ALIVE:
			on_keep_alive();
			break;

		case control::Opcode::KEEP_ALIVE_RSP:
			on_keep_alive_response();
			break;

		default:
			close(SessionCloseErrorCode::UNHANDLED_CONTROL_MESSAGE);
			break;
		}
	}